

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Cone(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var8;
  pointer paVar9;
  pointer paVar10;
  string *psVar11;
  int pAttrIdx;
  ulong uVar12;
  CX3DImporter_NodeElement *ne;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tvec;
  string an;
  string def;
  string use;
  bool local_cb;
  bool local_ca;
  bool local_c9;
  float local_c8;
  float local_c4;
  CX3DImporter_NodeElement *local_c0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  X3DImporter *local_38;
  undefined4 extraout_var_00;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_c0 = (CX3DImporter_NodeElement *)0x0;
  uVar6 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar6 < 1) {
    local_c4 = 1.0;
    local_ca = true;
    local_c8 = 2.0;
    local_c9 = true;
    local_cb = true;
  }
  else {
    local_c8 = 2.0;
    uVar12 = 0;
    local_c4 = 1.0;
    local_cb = true;
    local_c9 = true;
    local_ca = true;
    local_38 = this;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar12;
      iVar7 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar12);
      std::__cxx11::string::string
                ((string *)&local_98,(char *)CONCAT44(extraout_var,iVar7),(allocator *)&local_b8);
      iVar7 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar7 == 0) {
        iVar7 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar7);
        psVar11 = &local_78;
LAB_00743521:
        pcVar3 = (char *)psVar11->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar3,(ulong)__s);
        this = local_38;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar7 == 0) {
          iVar7 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar7);
          psVar11 = &local_58;
          goto LAB_00743521;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_98);
        if (((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&local_98), iVar7 != 0))
           && (iVar7 = std::__cxx11::string::compare((char *)&local_98), iVar7 != 0)) {
          iVar7 = std::__cxx11::string::compare((char *)&local_98);
          if (iVar7 == 0) {
            local_c9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_98);
            if (iVar7 == 0) {
              local_ca = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_98);
              if (iVar7 == 0) {
                local_cb = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_98);
                if (iVar7 == 0) {
                  local_c8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_98);
                  if (iVar7 == 0) {
                    local_c4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_98);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      uVar12 = (ulong)(pAttrIdx + 1U);
    } while (uVar6 != pAttrIdx + 1U);
  }
  if (local_58._M_string_length == 0) {
    local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c0 = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    local_c0->Type = ENET_Cone;
    (local_c0->ID)._M_dataplus._M_p = (pointer)&(local_c0->ID).field_2;
    (local_c0->ID)._M_string_length = 0;
    (local_c0->ID).field_2._M_local_buf[0] = '\0';
    local_c0->Parent = pCVar4;
    (local_c0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0->Child;
    (local_c0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0->Child;
    (local_c0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_c0->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry3D_009dc848;
    local_c0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_c0[1].Type = 0;
    *(CX3DImporter_NodeElement **)&local_c0[1].Type = local_c0 + 1;
    local_c0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_c0 + 1);
    local_c0[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_c0[1].ID._M_string_length = 0;
    local_c0[1].ID.field_2._M_local_buf[0] = '\x01';
    if (local_78._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_c0->ID);
    }
    if (local_ca == false) {
      paVar10 = local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((local_cb != false) &&
         (StandardShapes::MakeCircle(local_c4,0x1e,&local_b8),
         paVar10 = local_b8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_start !=
         local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_finish)) {
        paVar9 = local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          paVar9->y = local_c8 * -0.5;
          paVar9 = paVar9 + 1;
        } while (paVar9 != local_b8.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      StandardShapes::MakeCone(local_c8,0.0,local_c4,0x1e,&local_b8,(bool)(~local_cb & 1));
      paVar10 = local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    for (; pCVar4 = local_c0,
        paVar10 !=
        local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish; paVar10 = paVar10 + 1) {
      p_Var8 = (_List_node_base *)operator_new(0x20);
      *(float *)&p_Var8[1]._M_prev = paVar10->z;
      p_Var8[1]._M_next = *(_List_node_base **)paVar10;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
    }
    local_c0[1].ID.field_2._M_local_buf[0] = local_c9;
    local_c0[1].ID._M_string_length = 3;
    iVar7 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_c0;
    if ((char)iVar7 == '\0') {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Cone","");
      ParseNode_Metadata(this,pCVar4,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      p_Var8[1]._M_next = (_List_node_base *)local_c0;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_c0;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(this->NodeElement_List).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_78._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar5 = FindNodeElement(this,&local_58,ENET_Cone,&local_c0);
    if (!bVar5) {
      Throw_USE_NotFound(this,&local_58);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_c0;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Cone()
{
    std::string use, def;
    bool bottom = true;
    float bottomRadius = 1;
    float height = 2;
    bool side = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("side", side, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("bottom", bottom, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("height", height, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("bottomRadius", bottomRadius, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Cone, ne);
	}
	else
	{
		const unsigned int tess = 30;///TODO: IME tessellation factor through ai_property

		std::vector<aiVector3D> tvec;// temp array for vertices.

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Cone, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// make cone or parts according to flags.
		if(side)
		{
			StandardShapes::MakeCone(height, 0, bottomRadius, tess, tvec, !bottom);
		}
		else if(bottom)
		{
			StandardShapes::MakeCircle(bottomRadius, tess, tvec);
			height = -(height / 2);
			for(std::vector<aiVector3D>::iterator it = tvec.begin(); it != tvec.end(); ++it) it->y = height;// y - because circle made in oXZ.
		}

		// copy data from temp array
		for(std::vector<aiVector3D>::iterator it = tvec.begin(); it != tvec.end(); ++it) ((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices.push_back(*it);

		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Cone");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}